

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeUnreachable(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  Expression *expr;
  Ok local_19;
  IRBuilder *local_18;
  IRBuilder *this_local;
  
  local_18 = this;
  this_local = (IRBuilder *)__return_storage_ptr__;
  expr = (Expression *)Builder::makeUnreachable(&this->builder);
  push(this,expr);
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_19);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeUnreachable() {
  push(builder.makeUnreachable());
  return Ok{};
}